

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::CreateGeneratorTargets
          (cmGlobalGenerator *this,TargetTypes targetTypes,cmMakefile *mf,cmLocalGenerator *lg,
          map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
          *importedMap)

{
  bool bVar1;
  cmTargetMap *this_00;
  reference ppVar2;
  cmGeneratorTarget *this_01;
  reference ppcVar3;
  pointer ppVar4;
  _Rb_tree_const_iterator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_> local_b0;
  cmTarget *local_a8;
  cmTarget *t_1;
  iterator __end1;
  iterator __begin1;
  vector<cmTarget_*,_std::allocator<cmTarget_*>_> *__range1;
  cmGeneratorTarget *gt;
  cmTarget *t;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>
  *target;
  iterator __end2;
  iterator __begin2;
  cmTargetMap *__range2;
  map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
  *importedMap_local;
  cmLocalGenerator *lg_local;
  cmMakefile *mf_local;
  TargetTypes targetTypes_local;
  cmGlobalGenerator *this_local;
  
  if (targetTypes == AllTargets) {
    this_00 = cmMakefile::GetTargets_abi_cxx11_(mf);
    __end2 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
             ::begin(this_00);
    target = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>
              *)std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
                ::end(this_00);
    while (bVar1 = std::__detail::operator!=
                             (&__end2.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                              ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                                *)&target), bVar1) {
      ppVar2 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
               ::operator*(&__end2);
      this_01 = (cmGeneratorTarget *)operator_new(0x5a8);
      cmGeneratorTarget::cmGeneratorTarget(this_01,&ppVar2->second,lg);
      cmLocalGenerator::AddGeneratorTarget(lg,this_01);
      std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
      ::operator++(&__end2);
    }
  }
  cmMakefile::GetImportedTargets((vector<cmTarget_*,_std::allocator<cmTarget_*>_> *)&__begin1,mf);
  __end1 = std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::begin
                     ((vector<cmTarget_*,_std::allocator<cmTarget_*>_> *)&__begin1);
  t_1 = (cmTarget *)
        std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::end
                  ((vector<cmTarget_*,_std::allocator<cmTarget_*>_> *)&__begin1);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cmTarget_**,_std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>_>
                                     *)&t_1), bVar1) {
    ppcVar3 = __gnu_cxx::
              __normal_iterator<cmTarget_**,_std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>_>
              ::operator*(&__end1);
    local_a8 = *ppcVar3;
    local_b0._M_node =
         (_Base_ptr)
         std::
         map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
         ::find(importedMap,&local_a8);
    ppVar4 = std::_Rb_tree_const_iterator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>::
             operator->(&local_b0);
    cmLocalGenerator::AddImportedGeneratorTarget(lg,ppVar4->second);
    __gnu_cxx::__normal_iterator<cmTarget_**,_std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>_>
    ::operator++(&__end1);
  }
  std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::~vector
            ((vector<cmTarget_*,_std::allocator<cmTarget_*>_> *)&__begin1);
  return;
}

Assistant:

void cmGlobalGenerator::CreateGeneratorTargets(
  TargetTypes targetTypes, cmMakefile* mf, cmLocalGenerator* lg,
  std::map<cmTarget*, cmGeneratorTarget*> const& importedMap)
{
  if (targetTypes == AllTargets) {
    for (auto& target : mf->GetTargets()) {
      cmTarget* t = &target.second;
      cmGeneratorTarget* gt = new cmGeneratorTarget(t, lg);
      lg->AddGeneratorTarget(gt);
    }
  }

  for (cmTarget* t : mf->GetImportedTargets()) {
    lg->AddImportedGeneratorTarget(importedMap.find(t)->second);
  }
}